

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

void __thiscall
option::PrintUsageImplementation::LinePartIterator::update_length(LinePartIterator *this)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  
  this->screenlen = 0;
  iVar6 = 0;
  while( true ) {
    this->len = iVar6;
    pcVar2 = this->ptr;
    if (((byte)pcVar2[iVar6] < 0xc) && ((0xe01U >> ((byte)pcVar2[iVar6] & 0x1f) & 1) != 0)) break;
    this->screenlen = this->screenlen + 1;
    bVar1 = pcVar2[iVar6];
    if (0xc1 < bVar1) {
      uVar5 = bVar1 ^ 0xff;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar5 = ((uint)bVar1 << (~(byte)iVar3 & 0x1f)) >> (~(byte)iVar3 & 0x1f);
      pbVar7 = (byte *)(pcVar2 + iVar6);
      while( true ) {
        iVar6 = iVar6 + 1;
        pbVar7 = pbVar7 + 1;
        if (0x3f < (*pbVar7 ^ 0x80)) break;
        uVar5 = uVar5 << 6 ^ (uint)*pbVar7 ^ 0x80;
        this->len = iVar6;
      }
      if (0x10ff < uVar5) {
        bVar4 = isWideChar(uVar5);
        if (bVar4) {
          this->screenlen = this->screenlen + 1;
        }
      }
    }
    iVar6 = this->len + 1;
  }
  return;
}

Assistant:

void update_length()
    {
      screenlen = 0;
      for (len = 0; ptr[len] != 0 && ptr[len] != '\v' && ptr[len] != '\t' && ptr[len] != '\n'; ++len)
      {
        ++screenlen;
        unsigned ch = (unsigned char) ptr[len];
        if (ch > 0xC1) // everything <= 0xC1 (yes, even 0xC1 itself) is not a valid UTF-8 start byte
        {
          // int __builtin_clz (unsigned int x)
          // Returns the number of leading 0-bits in x, starting at the most significant bit
          unsigned mask = (unsigned) -1 >> __builtin_clz(ch ^ 0xff);
          ch = ch & mask; // mask out length bits, we don't verify their correctness
          while (((unsigned char) ptr[len + 1] ^ 0x80) <= 0x3F) // while next byte is continuation byte
          {
            ch = (ch << 6) ^ (unsigned char) ptr[len + 1] ^ 0x80; // add continuation to char code
            ++len;
          }
          // ch is the decoded unicode code point
          if (ch >= 0x1100 && isWideChar(ch)) // the test for 0x1100 is here to avoid the function call in the Latin case
            ++screenlen;
        }
      }
    }